

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O2

decNumber *
decCompareOp(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set,uint8_t op,
            uint32_t *status)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint blength;
  byte bVar5;
  undefined7 in_register_00000081;
  bool bVar6;
  int32_t residue;
  decContext *local_38;
  
  bVar4 = lhs->bits;
  if ((int)CONCAT71(in_register_00000081,op) == 4) {
    bVar5 = rhs->bits;
    if ((char)bVar4 < '\0') {
      if ((char)bVar5 < '\0') goto LAB_0023ba24;
      uVar3 = 0xffffffff;
    }
    else {
      if (-1 < (char)bVar5) goto LAB_0023ba24;
      uVar3 = 1;
    }
LAB_0023ba92:
    res->bits = '\0';
    res->lsu[0] = '\0';
    res->digits = 1;
    res->exponent = 0;
    if ((uVar3 != 0) && (res->lsu[0] = '\x01', (int)uVar3 < 0)) {
      res->bits = 0x80;
    }
  }
  else {
    bVar5 = rhs->bits;
LAB_0023ba24:
    if (((bVar5 | bVar4) & 0x30) == 0) {
      local_38 = set;
      uVar3 = decCompare(lhs,rhs,(byte)(op - 7) < 2);
LAB_0023ba7b:
      bVar6 = op == '\x04';
      switch(op) {
      case '\x01':
      case '\x04':
      case '\x06':
switchD_0023bad7_caseD_1:
        if ((bVar6) && (uVar3 == 0)) {
          iVar1 = rhs->exponent;
          iVar2 = lhs->exponent;
          uVar3 = 0;
          if (iVar2 != iVar1) {
            uVar3 = (uint)(iVar1 <= iVar2) * -2 + 1;
            if (-1 < (char)lhs->bits) {
              uVar3 = (uint)(iVar1 <= iVar2) * 2 - 1;
            }
          }
        }
        goto LAB_0023ba92;
      default:
        if (uVar3 == 0) {
          bVar4 = lhs->bits & 0x80;
          if (bVar4 == (rhs->bits & 0x80)) {
            if ((char)(rhs->bits & lhs->bits) < '\0') {
              bVar6 = lhs->exponent < rhs->exponent;
            }
            else {
              bVar6 = rhs->exponent < lhs->exponent;
            }
            uVar3 = (uint)bVar6 * 2 - 1;
          }
          else {
            uVar3 = -(uint)(bVar4 != 0) | 1;
          }
        }
        set = local_38;
        if ((op == '\b') || (op == '\x03')) {
          uVar3 = -uVar3;
        }
        break;
      case '\x05':
        goto switchD_0023bad7_caseD_5;
      }
    }
    else {
      if (op == '\x01') {
LAB_0023ba48:
        decNaNs(res,lhs,rhs,set,status);
        return res;
      }
      if (op == '\x06') {
        *status = *status | 0x40000080;
        goto LAB_0023ba48;
      }
      if (op == '\x04') {
        if ((bVar4 & 0x30) == 0) {
LAB_0023bb4e:
          uVar3 = 0xffffffff;
        }
        else {
          uVar3 = 1;
          if ((bVar5 & 0x30) != 0) {
            if (((bVar4 & 0x10) != 0) && ((bVar5 & 0x20) != 0)) goto LAB_0023bb4e;
            if (((bVar4 & 0x20) == 0) || ((bVar5 & 0x10) == 0)) {
              uVar3 = lhs->digits;
              if ((long)(int)uVar3 < 0x32) {
                uVar3 = (uint)""[(int)uVar3];
              }
              blength = rhs->digits;
              if ((long)(int)blength < 0x32) {
                blength = (uint)""[(int)blength];
              }
              local_38 = set;
              uVar3 = decUnitCompare(lhs->lsu,uVar3,rhs->lsu,blength,0);
              bVar4 = lhs->bits;
              set = local_38;
            }
          }
        }
        local_38 = set;
        if (-1 < (char)bVar4) goto LAB_0023ba7b;
        uVar3 = -uVar3;
        bVar6 = true;
        goto switchD_0023bad7_caseD_1;
      }
      if ((((bVar5 | bVar4) & 0x10) != 0) || (((bVar4 & 0x30) != 0 && ((bVar5 & 0x30) != 0))))
      goto LAB_0023ba48;
      uVar3 = -(bVar4 >> 5 & 1) | 1;
    }
    residue = 0;
    if (0 < (int)uVar3) {
      rhs = lhs;
    }
    decCopyFit(res,rhs,set,&residue,status);
    decFinalize(res,set,&residue,status);
  }
switchD_0023bad7_caseD_5:
  return res;
}

Assistant:

static decNumber * decCompareOp(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, decContext *set,
                         Flag op, uInt *status) {
  #if DECSUBSET
  decNumber *alloclhs=NULL;        /* non-NULL if rounded lhs allocated  */
  decNumber *allocrhs=NULL;        /* .., rhs  */
  #endif
  Int   result=0;                  /* default result value  */
  uByte merged;                    /* work  */

  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  do {                             /* protect allocated storage  */
    #if DECSUBSET
    if (!set->extended) {
      /* reduce operands and set lostDigits status, as needed  */
      if (lhs->digits>set->digits) {
        alloclhs=decRoundOperand(lhs, set, status);
        if (alloclhs==NULL) {result=BADINT; break;}
        lhs=alloclhs;
        }
      if (rhs->digits>set->digits) {
        allocrhs=decRoundOperand(rhs, set, status);
        if (allocrhs==NULL) {result=BADINT; break;}
        rhs=allocrhs;
        }
      }
    #endif
    /* [following code does not require input rounding]  */

    /* If total ordering then handle differing signs 'up front'  */
    if (op==COMPTOTAL) {                /* total ordering  */
      if (decNumberIsNegative(lhs) && !decNumberIsNegative(rhs)) {
        result=-1;
        break;
        }
      if (!decNumberIsNegative(lhs) && decNumberIsNegative(rhs)) {
        result=+1;
        break;
        }
      }

    /* handle NaNs specially; let infinities drop through  */
    /* This assumes sNaN (even just one) leads to NaN.  */
    merged=(lhs->bits | rhs->bits) & (DECSNAN | DECNAN);
    if (merged) {                       /* a NaN bit set  */
      if (op==COMPARE);                 /* result will be NaN  */
       else if (op==COMPSIG)            /* treat qNaN as sNaN  */
        *status|=DEC_Invalid_operation | DEC_sNaN;
       else if (op==COMPTOTAL) {        /* total ordering, always finite  */
        /* signs are known to be the same; compute the ordering here  */
        /* as if the signs are both positive, then invert for negatives  */
        if (!decNumberIsNaN(lhs)) result=-1;
         else if (!decNumberIsNaN(rhs)) result=+1;
         /* here if both NaNs  */
         else if (decNumberIsSNaN(lhs) && decNumberIsQNaN(rhs)) result=-1;
         else if (decNumberIsQNaN(lhs) && decNumberIsSNaN(rhs)) result=+1;
         else { /* both NaN or both sNaN  */
          /* now it just depends on the payload  */
          result=decUnitCompare(lhs->lsu, D2U(lhs->digits),
                                rhs->lsu, D2U(rhs->digits), 0);
          /* [Error not possible, as these are 'aligned']  */
          } /* both same NaNs  */
        if (decNumberIsNegative(lhs)) result=-result;
        break;
        } /* total order  */

       else if (merged & DECSNAN);           /* sNaN -> qNaN  */
       else { /* here if MIN or MAX and one or two quiet NaNs  */
        /* min or max -- 754 rules ignore single NaN  */
        if (!decNumberIsNaN(lhs) || !decNumberIsNaN(rhs)) {
          /* just one NaN; force choice to be the non-NaN operand  */
          op=COMPMAX;
          if (lhs->bits & DECNAN) result=-1; /* pick rhs  */
                             else result=+1; /* pick lhs  */
          break;
          }
        } /* max or min  */
      op=COMPNAN;                            /* use special path  */
      decNaNs(res, lhs, rhs, set, status);   /* propagate NaN  */
      break;
      }
    /* have numbers  */
    if (op==COMPMAXMAG || op==COMPMINMAG) result=decCompare(lhs, rhs, 1);
     else result=decCompare(lhs, rhs, 0);    /* sign matters  */
    } while(0);                              /* end protected  */

  if (result==BADINT) *status|=DEC_Insufficient_storage; /* rare  */
   else {
    if (op==COMPARE || op==COMPSIG ||op==COMPTOTAL) { /* returning signum  */
      if (op==COMPTOTAL && result==0) {
        /* operands are numerically equal or same NaN (and same sign,  */
        /* tested first); if identical, leave result 0  */
        if (lhs->exponent!=rhs->exponent) {
          if (lhs->exponent<rhs->exponent) result=-1;
           else result=+1;
          if (decNumberIsNegative(lhs)) result=-result;
          } /* lexp!=rexp  */
        } /* total-order by exponent  */
      uprv_decNumberZero(res);               /* [always a valid result]  */
      if (result!=0) {                  /* must be -1 or +1  */
        *res->lsu=1;
        if (result<0) res->bits=DECNEG;
        }
      }
     else if (op==COMPNAN);             /* special, drop through  */
     else {                             /* MAX or MIN, non-NaN result  */
      Int residue=0;                    /* rounding accumulator  */
      /* choose the operand for the result  */
      const decNumber *choice;
      if (result==0) { /* operands are numerically equal  */
        /* choose according to sign then exponent (see 754)  */
        uByte slhs=(lhs->bits & DECNEG);
        uByte srhs=(rhs->bits & DECNEG);
        #if DECSUBSET
        if (!set->extended) {           /* subset: force left-hand  */
          op=COMPMAX;
          result=+1;
          }
        else
        #endif
        if (slhs!=srhs) {          /* signs differ  */
          if (slhs) result=-1;     /* rhs is max  */
               else result=+1;     /* lhs is max  */
          }
         else if (slhs && srhs) {  /* both negative  */
          if (lhs->exponent<rhs->exponent) result=+1;
                                      else result=-1;
          /* [if equal, use lhs, technically identical]  */
          }
         else {                    /* both positive  */
          if (lhs->exponent>rhs->exponent) result=+1;
                                      else result=-1;
          /* [ditto]  */
          }
        } /* numerically equal  */
      /* here result will be non-0; reverse if looking for MIN  */
      if (op==COMPMIN || op==COMPMINMAG) result=-result;
      choice=(result>0 ? lhs : rhs);    /* choose  */
      /* copy chosen to result, rounding if need be  */
      decCopyFit(res, choice, set, &residue, status);
      decFinish(res, set, &residue, status);
      }
    }
  #if DECSUBSET
  if (allocrhs!=NULL) free(allocrhs);   /* free any storage used  */
  if (alloclhs!=NULL) free(alloclhs);   /* ..  */
  #endif
  return res;
  }